

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

void __thiscall wasm::SubTypes::~SubTypes(SubTypes *this)

{
  SubTypes *this_local;
  
  std::
  unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::~unordered_map(&this->typeSubTypes);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&this->types);
  return;
}

Assistant:

SubTypes(const std::vector<HeapType>& types) : types(types) {
    for (auto type : types) {
      note(type);
    }
  }